

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

void __thiscall
duckdb::IEJoinGlobalState::Sink(IEJoinGlobalState *this,DataChunk *input,IEJoinLocalState *lstate)

{
  reference this_00;
  type pGVar1;
  idx_t iVar2;
  LocalSortState *this_01;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
            ::operator[](&this->tables,this->child);
  pGVar1 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator*(this_00);
  this_01 = &(lstate->table).local_sort_state;
  PhysicalRangeJoin::LocalSortedTable::Sink(&lstate->table,input,&pGVar1->global_sort_state);
  iVar2 = LocalSortState::SizeInBytes(this_01);
  if (iVar2 < pGVar1->memory_per_thread) {
    return;
  }
  LocalSortState::Sort(this_01,&pGVar1->global_sort_state,true);
  return;
}

Assistant:

void Sink(DataChunk &input, IEJoinLocalState &lstate) {
		auto &table = *tables[child];
		auto &global_sort_state = table.global_sort_state;
		auto &local_sort_state = lstate.table.local_sort_state;

		// Sink the data into the local sort state
		lstate.table.Sink(input, global_sort_state);

		// When sorting data reaches a certain size, we sort it
		if (local_sort_state.SizeInBytes() >= table.memory_per_thread) {
			local_sort_state.Sort(global_sort_state, true);
		}
	}